

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_op_movl(DisasContext *s,int d_offset,int s_offset)

{
  TCGContext *tcg_ctx_00;
  TCGContext *tcg_ctx;
  int s_offset_local;
  int d_offset_local;
  DisasContext *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  tcg_gen_ld_i32(tcg_ctx_00,s->tmp2_i32,tcg_ctx_00->cpu_env,(long)s_offset);
  tcg_gen_st_i32(tcg_ctx_00,s->tmp2_i32,tcg_ctx_00->cpu_env,(long)d_offset);
  return;
}

Assistant:

static inline void gen_op_movl(DisasContext *s, int d_offset, int s_offset)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    tcg_gen_ld_i32(tcg_ctx, s->tmp2_i32, tcg_ctx->cpu_env, s_offset);
    tcg_gen_st_i32(tcg_ctx, s->tmp2_i32, tcg_ctx->cpu_env, d_offset);
}